

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::strArray<kj::Array<kj::String>>
          (String *__return_storage_ptr__,kj *this,Array<kj::String> *arr,char *delim)

{
  char *pcVar1;
  size_t __n;
  ArrayPtr<const_char> *first;
  size_t *psVar2;
  long lVar3;
  ulong uVar4;
  size_t i;
  char *pcVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  Array<kj::ArrayPtr<const_char>_> pieces_heap;
  ArrayPtr<const_char> pieces_stack [8];
  
  __n = strlen((char *)arr);
  pieces_heap.size_ = *(size_t *)(this + 8);
  pieces_stack[7].ptr = (char *)0x0;
  pieces_stack[7].size_ = 0;
  pieces_stack[6].ptr = (char *)0x0;
  pieces_stack[6].size_ = 0;
  pieces_stack[5].ptr = (char *)0x0;
  pieces_stack[5].size_ = 0;
  pieces_stack[4].ptr = (char *)0x0;
  pieces_stack[4].size_ = 0;
  pieces_stack[3].ptr = (char *)0x0;
  pieces_stack[3].size_ = 0;
  pieces_stack[2].ptr = (char *)0x0;
  pieces_stack[2].size_ = 0;
  pieces_stack[1].ptr = (char *)0x0;
  pieces_stack[1].size_ = 0;
  pieces_stack[0].ptr = (char *)0x0;
  pieces_stack[0].size_ = 0;
  if (pieces_heap.size_ < 9) {
    pieces_heap.ptr = (ArrayPtr<const_char> *)0x0;
    pieces_heap.size_ = 0;
    pieces_heap.disposer = (ArrayDisposer *)0x0;
    first = pieces_stack;
  }
  else {
    first = _::HeapArrayDisposer::allocate<kj::ArrayPtr<char_const>>(pieces_heap.size_);
    pieces_heap.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
    pieces_heap.ptr = first;
  }
  psVar2 = &first->size_;
  lVar3 = 8;
  pcVar6 = (char *)0x0;
  for (uVar4 = 0; uVar4 < *(ulong *)(this + 8); uVar4 = uVar4 + 1) {
    sVar7 = __n;
    if (uVar4 == 0) {
      sVar7 = 0;
    }
    pcVar1 = *(char **)(*(long *)this + lVar3);
    pcVar8 = pcVar1;
    if (pcVar1 != (char *)0x0) {
      pcVar8 = *(char **)(*(long *)this + -8 + lVar3);
    }
    pcVar5 = (char *)0x0;
    if (pcVar1 != (char *)0x0) {
      pcVar5 = pcVar1 + -1;
    }
    ((ArrayPtr<const_char> *)(psVar2 + -1))->ptr = pcVar8;
    *psVar2 = (size_t)pcVar5;
    pcVar6 = pcVar5 + (long)(pcVar6 + sVar7);
    psVar2 = psVar2 + 2;
    lVar3 = lVar3 + 0x18;
  }
  heapString(__return_storage_ptr__,(size_t)pcVar6);
  pcVar6 = (char *)(__return_storage_ptr__->content).size_;
  if (pcVar6 != (char *)0x0) {
    pcVar6 = (__return_storage_ptr__->content).ptr;
  }
  for (uVar4 = 0; uVar4 < *(ulong *)(this + 8); uVar4 = uVar4 + 1) {
    if (uVar4 != 0) {
      memcpy(pcVar6,arr,__n);
      pcVar6 = pcVar6 + __n;
    }
    pcVar6 = _::fill<kj::ArrayPtr<char_const>>(pcVar6,first);
    first = first + 1;
  }
  Array<kj::ArrayPtr<const_char>_>::~Array(&pieces_heap);
  return __return_storage_ptr__;
}

Assistant:

String strArray(T&& arr, const char* delim) {
  size_t delimLen = strlen(delim);
  KJ_STACK_ARRAY(decltype(_::STR * arr[0]), pieces, kj::size(arr), 8, 32);
  size_t size = 0;
  for (size_t i = 0; i < kj::size(arr); i++) {
    if (i > 0) size += delimLen;
    pieces[i] = _::STR * arr[i];
    size += pieces[i].size();
  }

  String result = heapString(size);
  char* pos = result.begin();
  for (size_t i = 0; i < kj::size(arr); i++) {
    if (i > 0) {
      memcpy(pos, delim, delimLen);
      pos += delimLen;
    }
    pos = _::fill(pos, pieces[i]);
  }
  return result;
}

template <typename... Params>
StringPtr strPreallocated(ArrayPtr<char> buffer, Params&&... params) {
  // Like str() but writes into a preallocated buffer. If the buffer is not long enough, the result
  // is truncated (but still NUL-terminated).
  //
  // This can be used like:
  //
  //     char buffer[256];
  //     StringPtr text = strPreallocated(buffer, params...);
  //
  // This is useful for optimization. It can also potentially be used safely in async signal
  // handlers. HOWEVER, to use in an async signal handler, all of the stringifiers for the inputs
  // must also be signal-safe. KJ guarantees signal safety when stringifying any built-in integer
  // type (but NOT floating-points), basic char/byte sequences (ArrayPtr<byte>, String, etc.), as
  // well as Array<T> as long as T can also be stringified safely. To safely stringify a delimited
  // array, you must use kj::delimited(arr, delim) rather than the deprecated
  // kj::strArray(arr, delim).

  char* end = _::fillLimited(buffer.begin(), buffer.end() - 1,
      toCharSequence(kj::fwd<Params>(params))...);
  *end = '\0';
  return StringPtr(buffer.begin(), end);
}

template <typename T, typename = decltype(toCharSequence(kj::instance<T&>()))>
inline _::Delimited<ArrayPtr<T>> operator*(const _::Stringifier&, ArrayPtr<T> arr) {
  return _::Delimited<ArrayPtr<T>>(arr, ", ");
}

template <typename T, typename = decltype(toCharSequence(kj::instance<const T&>()))>
inline _::Delimited<ArrayPtr<const T>> operator*(const _::Stringifier&, const Array<T>& arr) {
  return _::Delimited<ArrayPtr<const T>>(arr, ", ");
}

#define KJ_STRINGIFY(...) operator*(::kj::_::Stringifier, __VA_ARGS__)
// Defines a stringifier for a custom type.  Example:
//
//    class Foo {...};
//    inline StringPtr KJ_STRINGIFY(const Foo& foo) { return foo.name(); }
//      // or perhaps
//    inline String KJ_STRINGIFY(const Foo& foo) { return kj::str(foo.fld1(), ",", foo.fld2()); }
//
// This allows Foo to be passed to str().
//
// The function should be declared either in the same namespace as the target type or in the global
// namespace.  It can return any type which is an iterable container of chars.

// =======================================================================================
// Inline implementation details.

inline constexpr StringPtr::StringPtr(const String& value): content(value.cStr(), value.size() + 1) {}
inline constexpr StringPtr::StringPtr(const ConstString& value): content(value.cStr(), value.size() + 1) {}

inline constexpr StringPtr::operator ArrayPtr<const char>() const {
  return ArrayPtr<const char>(content.begin(), content.size() - 1);
}

inline constexpr ArrayPtr<const char> StringPtr::asArray() const {
  return ArrayPtr<const char>(content.begin(), content.size() - 1);
}

inline constexpr bool StringPtr::operator==(const StringPtr& other) const {
  return content == other.content;
}

inline constexpr bool StringPtr::operator< (const StringPtr& other) const {
  return content < other.content;
}

inline constexpr StringPtr StringPtr::slice(size_t start) const {
  return StringPtr(content.slice(start, content.size()));
}
inline constexpr ArrayPtr<const char> StringPtr::slice(size_t start, size_t end) const {
  return content.slice(start, end);
}
inline constexpr ArrayPtr<const char> StringPtr::first(size_t count) const { return slice(0, count); }

inline LiteralStringConst::operator ConstString() const {
  return ConstString(begin(), size(), NullArrayDisposer::instance);
}

inline ConstString StringPtr::attach() const {
  // This is meant as a roundabout way to make a ConstString from a StringPtr
  return ConstString(begin(), size(), NullArrayDisposer::instance);
}

template <typename... Attachments>
inline ConstString StringPtr::attach(Attachments&&... attachments) const {
  return ConstString { content.attach(kj::fwd<Attachments>(attachments)...) };
}

inline constexpr String::operator ArrayPtr<char>() {
  return content == nullptr ? ArrayPtr<char>(nullptr) : content.first(content.size() - 1);
}
inline constexpr String::operator ArrayPtr<const char>() const {
  return content == nullptr ? ArrayPtr<const char>(nullptr) : content.first(content.size() - 1);
}
inline constexpr ConstString::operator ArrayPtr<const char>() const {
  return content == nullptr ? ArrayPtr<const char>(nullptr) : content.first(content.size() - 1);
}

inline constexpr ArrayPtr<char> String::asArray() {
  return content == nullptr ? ArrayPtr<char>(nullptr) : content.first(content.size() - 1);
}
inline constexpr ArrayPtr<const char> String::asArray() const {
  return content == nullptr ? ArrayPtr<const char>(nullptr) : content.first(content.size() - 1);
}
inline constexpr ArrayPtr<const char> ConstString::asArray() const {
  return content == nullptr ? ArrayPtr<const char>(nullptr) : content.first(content.size() - 1);
}

inline constexpr const char* String::cStr() const { return content == nullptr ? "" : content.begin(); }
inline constexpr const char* ConstString::cStr() const { return content == nullptr ? "" : content.begin(); }

inline constexpr size_t String::size() const { return content == nullptr ? 0 : content.size() - 1; }
inline constexpr size_t ConstString::size() const { return content == nullptr ? 0 : content.size() - 1; }

inline constexpr char String::operator[](size_t index) const { return content[index]; }
inline constexpr char& String::operator[](size_t index) { return content[index]; }
inline constexpr char ConstString::operator[](size_t index) const { return content[index]; }

inline constexpr char* String::begin() { return content == nullptr ? nullptr : content.begin(); }
inline constexpr char* String::end() { return content == nullptr ? nullptr : content.end() - 1; }
inline constexpr const char* String::begin() const { return content == nullptr ? nullptr : content.begin(); }
inline constexpr const char* String::end() const { return content == nullptr ? nullptr : content.end() - 1; }
inline constexpr const char* ConstString::begin() const { return content == nullptr ? nullptr : content.begin(); }
inline constexpr const char* ConstString::end() const { return content == nullptr ? nullptr : content.end() - 1; }

inline String::String(char* value, size_t size, const ArrayDisposer& disposer)
    : content(value, size + 1, disposer) {
  KJ_IREQUIRE(value[size] == '\0', "String must be NUL-terminated.");
}
inline ConstString::ConstString(const char* value, size_t size, const ArrayDisposer& disposer)
    : content(value, size + 1, disposer) {
  KJ_IREQUIRE(value[size] == '\0', "String must be NUL-terminated.");
}

inline String::String(Array<char> buffer): content(kj::mv(buffer)) {
  KJ_IREQUIRE(content.size() > 0 && content.back() == '\0', "String must be NUL-terminated.");
}
inline ConstString::ConstString(Array<const char> buffer): content(kj::mv(buffer)) {
  KJ_IREQUIRE(content.size() > 0 && content.back() == '\0', "String must be NUL-terminated.");
}

inline String heapString(const char* value) {
  return heapString(value, strlen(value));
}
inline String heapString(StringPtr value) {
  return heapString(value.begin(), value.size());
}
inline String heapString(const String& value) {
  return heapString(value.begin(), value.size());
}
inline String heapString(ArrayPtr<const char> value) {
  return heapString(value.begin(), value.size());
}

namespace _ {  // private

template <typename T>
class Delimited {
public:
  Delimited(T array, kj::StringPtr delimiter)
      : array(kj::fwd<T>(array)), delimiter(delimiter) {}

  // TODO(someday): In theory we should support iteration as a character sequence, but the iterator
  //   will be pretty complicated.

  size_t size() {
    ensureStringifiedInitialized();

    size_t result = 0;
    bool first = true;
    for (auto& e: stringified) {
      if (first) {
        first = false;
      } else {
        result += delimiter.size();
      }
      result += e.size();
    }
    return result;
  }

  char* flattenTo(char* __restrict__ target) {
    ensureStringifiedInitialized();

    bool first = true;
    for (auto& elem: stringified) {
      if (first) {
        first = false;
      } else {
        target = fill(target, delimiter);
      }
      target = fill(target, elem);
    }
    return target;
  }

  char* flattenTo(char* __restrict__ target, char* limit) {
    // This is called in the strPreallocated(). We want to avoid allocation. size() will not have
    // been called in this case, so hopefully `stringified` is still uninitialized. We will
    // stringify each item and immediately use it.
    bool first = true;
    for (auto&& elem: array) {
      if (target == limit) return target;
      if (first) {
        first = false;
      } else {
        target = fillLimited(target, limit, delimiter);
      }
      target = fillLimited(target, limit, kj::toCharSequence(elem));
    }
    return target;
  }

private:
  typedef decltype(toCharSequence(*instance<T>().begin())) StringifiedItem;
  T array;
  kj::StringPtr delimiter;
  Array<StringifiedItem> stringified;

  void ensureStringifiedInitialized() {
    if (array.size() > 0 && stringified.size() == 0) {
      stringified = KJ_MAP(e, array) { return toCharSequence(e); };
    }
  }
};

template <typename T, typename... Rest>
char* fill(char* __restrict__ target, Delimited<T>&& first, Rest&&... rest) {
  target = first.flattenTo(target);
  return fill(target, kj::fwd<Rest>(rest)...);
}
template <typename T, typename... Rest>
char* fillLimited(char* __restrict__ target, char* limit, Delimited<T>&& first, Rest&&... rest) {
  target = first.flattenTo(target, limit);
  return fillLimited(target, limit, kj::fwd<Rest>(rest)...);
}
template <typename T, typename... Rest>
char* fill(char* __restrict__ target, Delimited<T>& first, Rest&&... rest) {
  target = first.flattenTo(target);
  return fill(target, kj::fwd<Rest>(rest)...);
}
template <typename T, typename... Rest>
char* fillLimited(char* __restrict__ target, char* limit, Delimited<T>& first, Rest&&... rest) {
  target = first.flattenTo(target, limit);
  return fillLimited(target, limit, kj::fwd<Rest>(rest)...);
}

template <typename T>
inline Delimited<T>&& KJ_STRINGIFY(Delimited<T>&& delimited) { return kj::mv(delimited); }
template <typename T>
inline const Delimited<T>& KJ_STRINGIFY(const Delimited<T>& delimited) { return delimited; }

}  // namespace _ (private)

template <typename T>
_::Delimited<T> delimited(T&& arr, kj::StringPtr delim) {
  return _::Delimited<T>(kj::fwd<T>(arr), delim);
}


template <typename T>
concept Stringifiable = requires(_::Stringifier s, T&& t) {
  { s * kj::fwd<T>(t) };
};

// TODO(someday) an ideal implementation would use kj::toCharSequence instead of kj::str,
// This would avoid an extra copy and allocation when the Maybe is embedded in a larger string.
template <typename T>
requires Stringifiable<T>
kj::String KJ_STRINGIFY(const kj::Maybe<T>& maybe) {
  KJ_IF_SOME(val, maybe) {
    return str(val);
  } else {
    return str("(none)");
  }
}